

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O2

void __thiscall
TEST_MockNamedValue_DoublesEqualIfWithinTolerance_Test::testBody
          (TEST_MockNamedValue_DoublesEqualIfWithinTolerance_Test *this)

{
  MockNamedValue *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_70;
  MockNamedValue other;
  
  (*((this->super_TEST_GROUP_CppUTestGroupMockNamedValue).value)->_vptr_MockNamedValue[10])
            (0x4014000000000000,0x3fd999999999999a);
  SimpleString::SimpleString(&local_70,"param2");
  MockNamedValue::MockNamedValue(&other,&local_70);
  SimpleString::~SimpleString(&local_70);
  MockNamedValue::setValue(&other,5.3);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockNamedValue).value;
  uVar2 = (*pMVar1->_vptr_MockNamedValue[0x14])(pMVar1,&other);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 0xff),"CHECK_TRUE","value->equals(other)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockNamedValueTest.cpp"
             ,0x82,pTVar4);
  MockNamedValue::~MockNamedValue(&other);
  return;
}

Assistant:

TEST(MockNamedValue, DoublesEqualIfWithinTolerance)
{
  value->setValue(5.0, 0.4);
  MockNamedValue other("param2");
  other.setValue(5.3);

  CHECK_TRUE(value->equals(other));
}